

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status google::protobuf::anon_unknown_21::ValidateFeatureSupport
                 (FeatureSupport *support,string_view full_name)

{
  bool bVar1;
  Edition EVar2;
  Edition EVar3;
  char *in_RCX;
  FieldOptions_FeatureSupport *this;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  basic_string_view<char,_std::char_traits<char>_> args_1_02;
  basic_string_view<char,_std::char_traits<char>_> args_1_03;
  FeatureSupport *support_local;
  string_view full_name_local;
  
  args_1._M_str = full_name._M_str;
  this = (FieldOptions_FeatureSupport *)full_name._M_len;
  bVar1 = FieldOptions_FeatureSupport::has_edition_deprecated(this);
  if (bVar1) {
    EVar2 = FieldOptions_FeatureSupport::edition_deprecated(this);
    EVar3 = FieldOptions_FeatureSupport::edition_introduced(this);
    if ((int)EVar2 < (int)EVar3) {
      args_1._M_len = (size_t)"Feature ";
      protobuf::(anonymous_namespace)::
      Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                ((char *)support,args_1,in_RCX);
      return (Status)(uintptr_t)support;
    }
    bVar1 = FieldOptions_FeatureSupport::has_deprecation_warning(this);
    if (!bVar1) {
      args_1_00._M_str = args_1._M_str;
      args_1_00._M_len = (size_t)"Feature ";
      protobuf::(anonymous_namespace)::
      Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                ((char *)support,args_1_00,in_RCX);
      return (Status)(uintptr_t)support;
    }
  }
  bVar1 = FieldOptions_FeatureSupport::has_edition_deprecated(this);
  if ((!bVar1) && (bVar1 = FieldOptions_FeatureSupport::has_deprecation_warning(this), bVar1)) {
    args_1_01._M_str = args_1._M_str;
    args_1_01._M_len = (size_t)"Feature ";
    protobuf::(anonymous_namespace)::
    Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
              ((char *)support,args_1_01,in_RCX);
    return (Status)(uintptr_t)support;
  }
  bVar1 = FieldOptions_FeatureSupport::has_edition_removed(this);
  if (bVar1) {
    EVar2 = FieldOptions_FeatureSupport::edition_deprecated(this);
    EVar3 = FieldOptions_FeatureSupport::edition_removed(this);
    if ((int)EVar3 <= (int)EVar2) {
      args_1_02._M_str = args_1._M_str;
      args_1_02._M_len = (size_t)"Feature ";
      protobuf::(anonymous_namespace)::
      Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                ((char *)support,args_1_02,in_RCX);
      return (Status)(uintptr_t)support;
    }
    EVar2 = FieldOptions_FeatureSupport::edition_removed(this);
    EVar3 = FieldOptions_FeatureSupport::edition_introduced(this);
    if ((int)EVar2 < (int)EVar3) {
      args_1_03._M_str = args_1._M_str;
      args_1_03._M_len = (size_t)"Feature ";
      protobuf::(anonymous_namespace)::
      Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                ((char *)support,args_1_03,in_RCX);
      return (Status)(uintptr_t)support;
    }
  }
  absl::lts_20250127::OkStatus();
  return (Status)(uintptr_t)support;
}

Assistant:

absl::Status ValidateFeatureSupport(const FieldOptions::FeatureSupport& support,
                                    absl::string_view full_name) {
  if (support.has_edition_deprecated()) {
    if (support.edition_deprecated() < support.edition_introduced()) {
      return Error("Feature ", full_name,
                   " was deprecated before it was introduced.");
    }
    if (!support.has_deprecation_warning()) {
      return Error(
          "Feature ", full_name,
          " is deprecated but does not specify a deprecation warning.");
    }
  }
  if (!support.has_edition_deprecated() && support.has_deprecation_warning()) {
    return Error("Feature ", full_name,
                 " specifies a deprecation warning but is not marked "
                 "deprecated in any edition.");
  }
  if (support.has_edition_removed()) {
    if (support.edition_deprecated() >= support.edition_removed()) {
      return Error("Feature ", full_name,
                   " was deprecated after it was removed.");
    }
    if (support.edition_removed() < support.edition_introduced()) {
      return Error("Feature ", full_name,
                   " was removed before it was introduced.");
    }
  }

  return absl::OkStatus();
}